

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O0

bool GEO::String::from_string<bool>(char *s,bool *value)

{
  int iVar1;
  bool *value_local;
  char *s_local;
  
  iVar1 = strcmp(s,"true");
  if (((iVar1 == 0) || (iVar1 = strcmp(s,"True"), iVar1 == 0)) ||
     (iVar1 = strcmp(s,"1"), iVar1 == 0)) {
    *value = true;
    return true;
  }
  iVar1 = strcmp(s,"false");
  if (((iVar1 != 0) && (iVar1 = strcmp(s,"False"), iVar1 != 0)) &&
     (iVar1 = strcmp(s,"0"), iVar1 != 0)) {
    return false;
  }
  *value = false;
  return true;
}

Assistant:

inline bool from_string(const char* s, bool& value) {
            if(strcmp(s, "true") == 0 ||
                strcmp(s, "True") == 0 ||
                strcmp(s, "1") == 0
            ) {
                value = true;
                return true;
            }
            if(strcmp(s, "false") == 0 ||
                strcmp(s, "False") == 0 ||
                strcmp(s, "0") == 0
            ) {
                value = false;
                return true;
            }
            return false;
        }